

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

int WebRtcAgc_get_config(void *agcInst,WebRtcAgcConfig *config)

{
  int iVar1;
  
  iVar1 = -1;
  if (agcInst != (void *)0x0) {
    if (config == (WebRtcAgcConfig *)0x0) {
      *(undefined2 *)((long)agcInst + 0x1a) = 0x4653;
      return iVar1;
    }
    if (*(short *)((long)agcInst + 0x18) != 0x2a) {
      *(undefined2 *)((long)agcInst + 0x1a) = 0x4652;
      return iVar1;
    }
    config->limiterEnable = *(uint8_t *)((long)agcInst + 0x16);
    config->targetLevelDbfs = *(int16_t *)((long)agcInst + 0x12);
    config->compressionGaindB = *(int16_t *)((long)agcInst + 0x14);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int WebRtcAgc_get_config(void *agcInst, WebRtcAgcConfig *config) {
    LegacyAgc *stt;
    stt = (LegacyAgc *) agcInst;

    if (stt == NULL) {
        return -1;
    }

    if (config == NULL) {
        stt->lastError = AGC_NULL_POINTER_ERROR;
        return -1;
    }

    if (stt->initFlag != kInitCheck) {
        stt->lastError = AGC_UNINITIALIZED_ERROR;
        return -1;
    }

    config->limiterEnable = stt->usedConfig.limiterEnable;
    config->targetLevelDbfs = stt->usedConfig.targetLevelDbfs;
    config->compressionGaindB = stt->usedConfig.compressionGaindB;

    return 0;
}